

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fundamental.cc
# Opt level: O0

double sfm::sampson_distance(FundamentalMatrix *F,Correspondence2D2D *m)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double *pdVar5;
  double dVar6;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  double local_28;
  double sum;
  double p2_F_p1;
  Correspondence2D2D *m_local;
  FundamentalMatrix *F_local;
  
  sum = 0.0;
  dVar6 = m->p2[0];
  dVar1 = m->p1[0];
  p2_F_p1 = (double)m;
  m_local = (Correspondence2D2D *)F;
  pdVar5 = math::Matrix<double,_3,_3>::operator[](F,0);
  dVar2 = *pdVar5;
  dVar3 = *(double *)((long)p2_F_p1 + 8);
  pdVar5 = math::Matrix<double,_3,_3>::operator[]((Matrix<double,_3,_3> *)m_local,1);
  dVar4 = *pdVar5;
  pdVar5 = math::Matrix<double,_3,_3>::operator[]((Matrix<double,_3,_3> *)m_local,2);
  sum = dVar6 * (dVar1 * dVar2 + dVar3 * dVar4 + *pdVar5) + sum;
  dVar6 = *(double *)((long)p2_F_p1 + 0x18);
  dVar1 = *(double *)p2_F_p1;
  pdVar5 = math::Matrix<double,_3,_3>::operator[]((Matrix<double,_3,_3> *)m_local,3);
  dVar2 = *pdVar5;
  dVar3 = *(double *)((long)p2_F_p1 + 8);
  pdVar5 = math::Matrix<double,_3,_3>::operator[]((Matrix<double,_3,_3> *)m_local,4);
  dVar4 = *pdVar5;
  pdVar5 = math::Matrix<double,_3,_3>::operator[]((Matrix<double,_3,_3> *)m_local,5);
  sum = dVar6 * (dVar1 * dVar2 + dVar3 * dVar4 + *pdVar5) + sum;
  dVar6 = *(double *)p2_F_p1;
  pdVar5 = math::Matrix<double,_3,_3>::operator[]((Matrix<double,_3,_3> *)m_local,6);
  dVar1 = *pdVar5;
  dVar2 = *(double *)((long)p2_F_p1 + 8);
  pdVar5 = math::Matrix<double,_3,_3>::operator[]((Matrix<double,_3,_3> *)m_local,7);
  dVar3 = *pdVar5;
  pdVar5 = math::Matrix<double,_3,_3>::operator[]((Matrix<double,_3,_3> *)m_local,8);
  dVar6 = dVar6 * dVar1 + dVar2 * dVar3 + *pdVar5 + sum;
  sum = dVar6 * dVar6;
  local_28 = 0.0;
  dVar6 = *(double *)p2_F_p1;
  pdVar5 = math::Matrix<double,_3,_3>::operator[]((Matrix<double,_3,_3> *)m_local,0);
  dVar1 = *pdVar5;
  dVar2 = *(double *)((long)p2_F_p1 + 8);
  pdVar5 = math::Matrix<double,_3,_3>::operator[]((Matrix<double,_3,_3> *)m_local,1);
  dVar3 = *pdVar5;
  pdVar5 = math::Matrix<double,_3,_3>::operator[]((Matrix<double,_3,_3> *)m_local,2);
  local_30 = dVar6 * dVar1 + dVar2 * dVar3 + *pdVar5;
  dVar6 = math::fastpow<double>(&local_30,2);
  local_28 = dVar6 + local_28;
  dVar6 = *(double *)p2_F_p1;
  pdVar5 = math::Matrix<double,_3,_3>::operator[]((Matrix<double,_3,_3> *)m_local,3);
  dVar1 = *pdVar5;
  dVar2 = *(double *)((long)p2_F_p1 + 8);
  pdVar5 = math::Matrix<double,_3,_3>::operator[]((Matrix<double,_3,_3> *)m_local,4);
  dVar3 = *pdVar5;
  pdVar5 = math::Matrix<double,_3,_3>::operator[]((Matrix<double,_3,_3> *)m_local,5);
  local_38 = dVar6 * dVar1 + dVar2 * dVar3 + *pdVar5;
  dVar6 = math::fastpow<double>(&local_38,2);
  local_28 = dVar6 + local_28;
  dVar6 = *(double *)((long)p2_F_p1 + 0x10);
  pdVar5 = math::Matrix<double,_3,_3>::operator[]((Matrix<double,_3,_3> *)m_local,0);
  dVar1 = *pdVar5;
  dVar2 = *(double *)((long)p2_F_p1 + 0x18);
  pdVar5 = math::Matrix<double,_3,_3>::operator[]((Matrix<double,_3,_3> *)m_local,3);
  dVar3 = *pdVar5;
  pdVar5 = math::Matrix<double,_3,_3>::operator[]((Matrix<double,_3,_3> *)m_local,6);
  local_40 = dVar6 * dVar1 + dVar2 * dVar3 + *pdVar5;
  dVar6 = math::fastpow<double>(&local_40,2);
  local_28 = dVar6 + local_28;
  dVar6 = *(double *)((long)p2_F_p1 + 0x10);
  pdVar5 = math::Matrix<double,_3,_3>::operator[]((Matrix<double,_3,_3> *)m_local,1);
  dVar1 = *pdVar5;
  dVar2 = *(double *)((long)p2_F_p1 + 0x18);
  pdVar5 = math::Matrix<double,_3,_3>::operator[]((Matrix<double,_3,_3> *)m_local,4);
  dVar3 = *pdVar5;
  pdVar5 = math::Matrix<double,_3,_3>::operator[]((Matrix<double,_3,_3> *)m_local,7);
  local_48 = dVar6 * dVar1 + dVar2 * dVar3 + *pdVar5;
  dVar6 = math::fastpow<double>(&local_48,2);
  return sum / (dVar6 + local_28);
}

Assistant:

double
sampson_distance (FundamentalMatrix const& F, Correspondence2D2D const& m)
{
    /*
     * Computes the Sampson distance SD for a given match and fundamental
     * matrix. SD is computed as [Sect 11.4.3, Hartley, Zisserman]:
     *
     *   SD = (x'Fx)^2 / ( (Fx)_1^2 + (Fx)_2^2 + (x'F)_1^2 + (x'F)_2^2 )
     */

    double p2_F_p1 = 0.0;
    p2_F_p1 += m.p2[0] * (m.p1[0] * F[0] + m.p1[1] * F[1] + F[2]);
    p2_F_p1 += m.p2[1] * (m.p1[0] * F[3] + m.p1[1] * F[4] + F[5]);
    p2_F_p1 +=     1.0 * (m.p1[0] * F[6] + m.p1[1] * F[7] + F[8]);
    p2_F_p1 *= p2_F_p1;

    double sum = 0.0;
    sum += math::fastpow(m.p1[0] * F[0] + m.p1[1] * F[1] + F[2], 2);
    sum += math::fastpow(m.p1[0] * F[3] + m.p1[1] * F[4] + F[5], 2);
    sum += math::fastpow(m.p2[0] * F[0] + m.p2[1] * F[3] + F[6], 2);
    sum += math::fastpow(m.p2[0] * F[1] + m.p2[1] * F[4] + F[7], 2);

    return p2_F_p1 / sum;
}